

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

bool __thiscall
libtorrent::peer_list::update_peer_port
          (peer_list *this,int port,torrent_peer *p,peer_source_flags_t src,torrent_state *state)

{
  peer_connection_interface *ppVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  reference pptVar5;
  int delta;
  match_peer_endpoint __pred;
  undefined1 local_148 [7];
  bool was_conn_cand;
  undefined1 local_121;
  error_code local_120;
  byte local_109;
  torrent_peer *ptStack_108;
  bool was_conn_cand_1;
  torrent_peer *pp;
  undefined2 local_f8;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_f0;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_d0;
  undefined1 local_b0 [8];
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  i;
  pair<std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>,_std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>_>
  range;
  address addr;
  torrent_state *state_local;
  torrent_peer *p_local;
  int port_local;
  peer_list *this_local;
  peer_source_flags_t src_local;
  
  if ((uint)p->port != port) {
    this_local._6_1_ = src.m_val;
    if ((state->allow_multiple_connections_per_ip & 1U) != 0) {
      torrent_peer::address((address *)&range.second._M_node,p);
      find_peers((pair<std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>,_std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>_>
                  *)&i._M_node,this,(address *)&range.second._M_node);
      std::
      _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
      ::_Deque_iterator(&local_d0,
                        (_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                         *)&i._M_node);
      std::
      _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
      ::_Deque_iterator(&local_f0,
                        (_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                         *)&range.first._M_node);
      anon_unknown.dwarf_59aa8a::match_peer_endpoint::match_peer_endpoint
                ((match_peer_endpoint *)&pp,(address *)&range.second._M_node,(uint16_t)port);
      __pred._10_6_ = 0;
      __pred.m_addr = (address *)pp;
      __pred.m_port = local_f8;
      std::
      find_if<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,(anonymous_namespace)::match_peer_endpoint>
                ((_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                  *)local_b0,&local_d0,&local_f0,__pred);
      bVar2 = std::operator!=((_Self *)local_b0,(_Self *)&range.first._M_node);
      if (bVar2) {
        pptVar5 = std::
                  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                  ::operator*((_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                               *)local_b0);
        ptStack_108 = *pptVar5;
        if (ptStack_108->connection != (peer_connection_interface *)0x0) {
          local_109 = is_connect_candidate(this,ptStack_108);
          *(uint *)&ptStack_108->field_0x1b = *(uint *)&ptStack_108->field_0x1b & 0xffffffdf | 0x20;
          bVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_unsigned_char
                            ((bitfield_flag *)((long)&this_local + 6));
          *(uint *)&ptStack_108->field_0x1b =
               *(uint *)&ptStack_108->field_0x1b & 0xffc0ffff |
               (*(uint *)&ptStack_108->field_0x1b >> 0x10 & 0x3f | bVar3 & 0x3f) << 0x10;
          if (((local_109 & 1) == 0) && (bVar2 = is_connect_candidate(this,ptStack_108), bVar2)) {
            update_connect_candidates(this,1);
          }
          this->m_locked_peer = p;
          ppVar1 = p->connection;
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    (&local_120,duplicate_peer_id,(type *)0x0);
          local_121 = 0;
          (*ppVar1->_vptr_peer_connection_interface[2])(ppVar1,&local_120,1,0);
          this->m_locked_peer = (torrent_peer *)0x0;
          erase_peer(this,p,state);
          return false;
        }
        std::
        _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
        ::_Deque_iterator((_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                           *)local_148,
                          (_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                           *)local_b0);
        erase_peer(this,(iterator *)local_148,state);
      }
    }
    bVar2 = is_connect_candidate(this,p);
    p->port = (uint16_t)port;
    bVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_unsigned_char
                      ((bitfield_flag *)((long)&this_local + 6));
    *(uint *)&p->field_0x1b =
         *(uint *)&p->field_0x1b & 0xffc0ffff |
         (*(uint *)&p->field_0x1b >> 0x10 & 0x3f | bVar3 & 0x3f) << 0x10;
    *(uint *)&p->field_0x1b = *(uint *)&p->field_0x1b & 0xffffffdf | 0x20;
    bVar4 = is_connect_candidate(this,p);
    if (bVar2 != bVar4) {
      delta = 1;
      if (bVar2) {
        delta = -1;
      }
      update_connect_candidates(this,delta);
    }
  }
  return true;
}

Assistant:

bool peer_list::update_peer_port(int const port, torrent_peer* p
		, peer_source_flags_t const src, torrent_state* state)
	{
		TORRENT_ASSERT(p != nullptr);
		TORRENT_ASSERT(p->connection);
		TORRENT_ASSERT(p->in_use);
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		if (p->port == port) return true;

		if (state->allow_multiple_connections_per_ip)
		{
			auto const addr = p->address();
			auto const range = find_peers(addr);
			auto const i = std::find_if(range.first, range.second
				, match_peer_endpoint(addr, std::uint16_t(port)));
			if (i != range.second)
			{
				torrent_peer& pp = **i;
				TORRENT_ASSERT(pp.in_use);
				if (pp.connection)
				{
					bool const was_conn_cand = is_connect_candidate(pp);
					// if we already have an entry with this
					// new endpoint, disconnect this one
					pp.connectable = true;
					pp.source |= static_cast<std::uint8_t>(src);
					if (!was_conn_cand && is_connect_candidate(pp))
						update_connect_candidates(1);
					// calling disconnect() on a peer, may actually end
					// up "garbage collecting" its torrent_peer entry
					// as well, if it's considered useless (which this specific)
					// case will, since it was an incoming peer that just disconnected
					// and we allow multiple connections per IP. Because of that,
					// we need to make sure we don't let it do that, locking i
					TORRENT_ASSERT(m_locked_peer == nullptr);
					m_locked_peer = p;
					p->connection->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					m_locked_peer = nullptr;
					erase_peer(p, state);
					return false;
				}
				erase_peer(i, state);
			}
		}
#if TORRENT_USE_ASSERTS
		else
		{
#if TORRENT_USE_I2P
			if (!p->is_i2p_addr)
#endif
			{
				std::pair<iterator, iterator> range = find_peers(p->address());
				TORRENT_ASSERT(std::distance(range.first, range.second) == 1);
			}
		}
#endif

		bool const was_conn_cand = is_connect_candidate(*p);
		p->port = std::uint16_t(port);
		p->source |= static_cast<std::uint8_t>(src);
		p->connectable = true;

		if (was_conn_cand != is_connect_candidate(*p))
			update_connect_candidates(was_conn_cand ? -1 : 1);
		return true;
	}